

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O0

uint * Csw_CutComputeTruth(Csw_Man_t *p,Csw_Cut_t *pCut,Csw_Cut_t *pCut0,Csw_Cut_t *pCut1,
                          int fCompl0,int fCompl1)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  int fCompl1_local;
  int fCompl0_local;
  Csw_Cut_t *pCut1_local;
  Csw_Cut_t *pCut0_local;
  Csw_Cut_t *pCut_local;
  Csw_Man_t *p_local;
  
  if (fCompl0 == 0) {
    puVar5 = p->puTemp[0];
    puVar4 = Csw_CutTruth(pCut0);
    Kit_TruthCopy(puVar5,puVar4,p->nLeafMax);
  }
  else {
    puVar5 = p->puTemp[0];
    puVar4 = Csw_CutTruth(pCut0);
    Kit_TruthNot(puVar5,puVar4,p->nLeafMax);
  }
  puVar5 = p->puTemp[2];
  puVar4 = p->puTemp[0];
  cVar1 = pCut0->nFanins;
  iVar2 = p->nLeafMax;
  uVar3 = Cut_TruthPhase(pCut,pCut0);
  Kit_TruthStretch(puVar5,puVar4,(int)cVar1,iVar2,uVar3,0);
  if (fCompl1 == 0) {
    puVar5 = p->puTemp[1];
    puVar4 = Csw_CutTruth(pCut1);
    Kit_TruthCopy(puVar5,puVar4,p->nLeafMax);
  }
  else {
    puVar5 = p->puTemp[1];
    puVar4 = Csw_CutTruth(pCut1);
    Kit_TruthNot(puVar5,puVar4,p->nLeafMax);
  }
  puVar5 = p->puTemp[3];
  puVar4 = p->puTemp[1];
  cVar1 = pCut1->nFanins;
  iVar2 = p->nLeafMax;
  uVar3 = Cut_TruthPhase(pCut,pCut1);
  Kit_TruthStretch(puVar5,puVar4,(int)cVar1,iVar2,uVar3,0);
  puVar5 = Csw_CutTruth(pCut);
  Kit_TruthAnd(puVar5,p->puTemp[2],p->puTemp[3],p->nLeafMax);
  puVar5 = Csw_CutTruth(pCut);
  return puVar5;
}

Assistant:

unsigned * Csw_CutComputeTruth( Csw_Man_t * p, Csw_Cut_t * pCut, Csw_Cut_t * pCut0, Csw_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    // permute the first table
    if ( fCompl0 ) 
        Kit_TruthNot( p->puTemp[0], Csw_CutTruth(pCut0), p->nLeafMax );
    else
        Kit_TruthCopy( p->puTemp[0], Csw_CutTruth(pCut0), p->nLeafMax );
    Kit_TruthStretch( p->puTemp[2], p->puTemp[0], pCut0->nFanins, p->nLeafMax, Cut_TruthPhase(pCut, pCut0), 0 );
    // permute the second table
    if ( fCompl1 ) 
        Kit_TruthNot( p->puTemp[1], Csw_CutTruth(pCut1), p->nLeafMax );
    else
        Kit_TruthCopy( p->puTemp[1], Csw_CutTruth(pCut1), p->nLeafMax );
    Kit_TruthStretch( p->puTemp[3], p->puTemp[1], pCut1->nFanins, p->nLeafMax, Cut_TruthPhase(pCut, pCut1), 0 );
    // produce the resulting table
    Kit_TruthAnd( Csw_CutTruth(pCut), p->puTemp[2], p->puTemp[3], p->nLeafMax );
//    assert( pCut->nFanins >= Kit_TruthSupportSize( Csw_CutTruth(pCut), p->nLeafMax ) );
    return Csw_CutTruth(pCut);
}